

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O2

bool __thiscall
cmGlobalGhsMultiGenerator::SetGeneratorToolset
          (cmGlobalGhsMultiGenerator *this,string *ts,bool build,cmMakefile *mf)

{
  bool bVar1;
  cmValue c2;
  undefined7 in_register_00000011;
  char *__rhs;
  string_view value;
  allocator<char> local_9a;
  allocator<char> local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string tsp;
  allocator<char> local_58 [32];
  string gbuild;
  
  if ((int)CONCAT71(in_register_00000011,build) == 0) {
    tsp._M_dataplus._M_p = (pointer)&tsp.field_2;
    tsp._M_string_length = 0;
    tsp.field_2._M_local_buf[0] = '\0';
    GetToolset(this,mf,&tsp,ts);
    if (tsp._M_string_length == 0) {
      bVar1 = false;
    }
    else {
      __rhs = "/";
      if (tsp._M_dataplus._M_p[tsp._M_string_length - 1] == '/') {
        __rhs = "";
      }
      std::operator+(&local_98,&tsp,__rhs);
      std::operator+(&gbuild,&local_98,DEFAULT_BUILD_PROGRAM);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"CMAKE_MAKE_PROGRAM",local_58);
      c2 = cmMakefile::GetDefinition(mf,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      if (((c2.Value == (string *)0x0) || ((c2.Value)->_M_string_length == 0)) ||
         (bVar1 = cmsys::SystemTools::ComparePath(&gbuild,c2.Value), bVar1)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_98,"CMAKE_MAKE_PROGRAM",&local_9a);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_58,"build program to use",&local_99);
        cmMakefile::AddCacheDefinition(mf,&local_98,&gbuild,(string *)local_58,INTERNAL,true);
        std::__cxx11::string::~string((string *)local_58);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_98,"CMAKE_SYSTEM_VERSION",local_58);
        value._M_str = tsp._M_dataplus._M_p;
        value._M_len = tsp._M_string_length;
        cmMakefile::AddDefinition(mf,&local_98,value);
        std::__cxx11::string::~string((string *)&local_98);
        bVar1 = true;
      }
      else {
        local_58[0] = (allocator<char>)0xa;
        local_9a = (allocator<char>)0xa;
        cmStrCat<char_const(&)[21],std::__cxx11::string&,char,char_const(&)[48],std::__cxx11::string_const&,char,char_const(&)[103]>
                  (&local_98,(char (*) [21])"toolset build tool: ",&gbuild,(char *)local_58,
                   (char (*) [48])"Does not match the previously used build tool: ",c2.Value,
                   (char *)&local_9a,
                   (char (*) [103])
                   "Either remove the CMakeCache.txt file and CMakeFiles directory or choose a different binary directory."
                  );
        cmMakefile::IssueMessage(mf,FATAL_ERROR,&local_98);
        std::__cxx11::string::~string((string *)&local_98);
        bVar1 = false;
      }
      std::__cxx11::string::~string((string *)&gbuild);
    }
    std::__cxx11::string::~string((string *)&tsp);
    return bVar1;
  }
  return true;
}

Assistant:

bool cmGlobalGhsMultiGenerator::SetGeneratorToolset(std::string const& ts,
                                                    bool build, cmMakefile* mf)
{
  /* In build mode nothing to be done.
   * Toolset already determined and build tool absolute path is cached.
   */
  if (build) {
    return true;
  }

  /* Determine the absolute directory for the toolset */
  std::string tsp;
  this->GetToolset(mf, tsp, ts);

  /* no toolset was found */
  if (tsp.empty()) {
    return false;
  }

  /* set the build tool to use */
  std::string gbuild(tsp + ((tsp.back() == '/') ? "" : "/") +
                     DEFAULT_BUILD_PROGRAM);
  cmValue prevTool = mf->GetDefinition("CMAKE_MAKE_PROGRAM");

  /* check if the toolset changed from last generate */
  if (cmNonempty(prevTool) && !cmSystemTools::ComparePath(gbuild, *prevTool)) {
    std::string const& e = cmStrCat(
      "toolset build tool: ", gbuild, '\n',
      "Does not match the previously used build tool: ", *prevTool, '\n',
      "Either remove the CMakeCache.txt file and CMakeFiles "
      "directory or choose a different binary directory.");
    mf->IssueMessage(MessageType::FATAL_ERROR, e);
    return false;
  }

  /* store the toolset that is being used for this build */
  mf->AddCacheDefinition("CMAKE_MAKE_PROGRAM", gbuild, "build program to use",
                         cmStateEnums::INTERNAL, true);

  mf->AddDefinition("CMAKE_SYSTEM_VERSION", tsp);

  return true;
}